

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O2

void __thiscall TPZGenPartialGrid::SetBC(TPZGenPartialGrid *this,TPZGeoMesh *g,int side,int bc)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  TPZGeoElBC TStack_108;
  TPZVec<long> cornernodes;
  TPZStack<int,_10> Sides;
  TPZStack<TPZGeoEl_*,_10> ElementVec;
  
  switch(side) {
  case 0:
    piVar5 = (this->fRangey).fStore;
    goto LAB_011efa87;
  case 1:
    if ((this->fRangex).fStore[1] != *(this->fNx).fStore) {
      return;
    }
    break;
  case 2:
    if ((this->fRangey).fStore[1] != (this->fNx).fStore[1]) {
      return;
    }
    break;
  case 3:
    piVar5 = (this->fRangex).fStore;
LAB_011efa87:
    if (*piVar5 != 0) {
      return;
    }
  }
  TPZStack<TPZGeoEl_*,_10>::TPZStack(&ElementVec);
  TPZStack<int,_10>::TPZStack(&Sides);
  TPZVec<long>::TPZVec(&cornernodes,4);
  piVar5 = (this->fRangex).fStore;
  iVar1 = *piVar5;
  piVar3 = (this->fRangey).fStore;
  iVar4 = *(this->fNx).fStore + 1;
  iVar6 = *piVar3 * iVar4;
  *cornernodes.fStore = (long)(iVar6 + iVar1);
  iVar2 = piVar5[1];
  cornernodes.fStore[1] = (long)(iVar6 + iVar2);
  iVar4 = iVar4 * piVar3[1];
  cornernodes.fStore[2] = (long)(iVar2 + iVar4);
  cornernodes.fStore[3] = (long)(iVar4 + iVar1);
  TPZGeoMesh::GetBoundaryElements
            (g,cornernodes.fStore[side],cornernodes.fStore[(side + 1) % 4],&ElementVec,&Sides);
  lVar7 = 0;
  if (ElementVec.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNElements < 1) {
    ElementVec.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNElements = lVar7;
  }
  for (; ElementVec.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fNElements != lVar7;
      lVar7 = lVar7 + 1) {
    if (ElementVec.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore[lVar7] !=
        (TPZGeoEl *)0x0) {
      TPZGeoElBC::TPZGeoElBC
                (&TStack_108,
                 ElementVec.super_TPZManVector<TPZGeoEl_*,_10>.super_TPZVec<TPZGeoEl_*>.fStore
                 [lVar7],Sides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar7],bc);
    }
  }
  TPZVec<long>::~TPZVec(&cornernodes);
  TPZManVector<int,_10>::~TPZManVector(&Sides.super_TPZManVector<int,_10>);
  TPZManVector<TPZGeoEl_*,_10>::~TPZManVector(&ElementVec.super_TPZManVector<TPZGeoEl_*,_10>);
  return;
}

Assistant:

void TPZGenPartialGrid::SetBC(TPZGeoMesh &g, int side, int bc) {
	if(side == 0 && fRangey[0] != 0) return;
	if(side == 1 && fRangex[1] != fNx[0]) return;
	if(side == 2 && fRangey[1] != fNx[1]) return;
	if(side == 3 && fRangex[0] != 0) return;
	TPZStack<TPZGeoEl*> ElementVec;
	TPZStack<int> Sides;
	TPZVec<int64_t> cornernodes(4);
	cornernodes[0] = NodeIndex(fRangex[0],fRangey[0]);
	cornernodes[1] = NodeIndex(fRangex[1],fRangey[0]);
	cornernodes[2] = NodeIndex(fRangex[1],fRangey[1]);
	cornernodes[3] = NodeIndex(fRangex[0],fRangey[1]);
	g.GetBoundaryElements(cornernodes[side],cornernodes[(side+1)%4],ElementVec, Sides);
	int64_t numel = ElementVec.NElements();
	for(int64_t el=0; el<numel; el++) {
		TPZGeoEl *gel = (TPZGeoEl *) ElementVec[el];
		if(gel) {
			TPZGeoElBC(gel,Sides[el],bc);
		}
	}
}